

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_specialization_constant_op
          (CompilerGLSL *this,SPIRConstantOp *constant)

{
  SPIRType *pSVar1;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string name;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(constant->basetype).id);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&name,this,(ulong)(constant->super_IVariant).self.id,1);
  (*(this->super_Compiler)._vptr_Compiler[0x1a])(&local_60,this,pSVar1,&name,0);
  constant_op_expression_abi_cxx11_(&local_80,this,constant);
  statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,(char (*) [7])0x305d7c,&local_60,(char (*) [4])0x31e8c7,&local_80,
             (char (*) [2])0x304bae);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void CompilerGLSL::emit_specialization_constant_op(const SPIRConstantOp &constant)
{
	auto &type = get<SPIRType>(constant.basetype);
	auto name = to_name(constant.self);
	statement("const ", variable_decl(type, name), " = ", constant_op_expression(constant), ";");
}